

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

iterator * __thiscall HighsHashTable<int,_double>::begin(HighsHashTable<int,_double> *this)

{
  bool bVar1;
  long lVar2;
  pointer pos_;
  pointer puVar3;
  unique_ptr<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter> *this_00;
  pointer pHVar4;
  type puVar5;
  HighsHashTable<int,_double> *in_RSI;
  HashTableIterator<HighsHashTableEntry<int,_double>_> *in_RDI;
  u64 capacity;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffd0;
  HighsHashTable<int,_double> *in_stack_fffffffffffffff0;
  
  if (in_RSI->numElements == 0) {
    end(in_stack_fffffffffffffff0);
  }
  else {
    lVar2 = in_RSI->tableSizeMask + 1;
    pos_ = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (in_stack_ffffffffffffffd0);
    puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (in_stack_ffffffffffffffd0);
    this_00 = (unique_ptr<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
               *)(puVar3 + lVar2);
    pHVar4 = std::
             unique_ptr<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
             ::get(this_00);
    HashTableIterator<HighsHashTableEntry<int,_double>_>::HashTableIterator
              (in_RDI,pos_,(u8 *)this_00,pHVar4 + lVar2);
    puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        this_00,(size_t)pos_);
    bVar1 = occupied(in_RSI,*puVar5);
    if (!bVar1) {
      HashTableIterator<HighsHashTableEntry<int,_double>_>::operator++(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

iterator begin() {
    if (numElements == 0) return end();
    u64 capacity = tableSizeMask + 1;
    iterator iter{metadata.get(), metadata.get() + capacity,
                  entries.get() + capacity};
    if (!occupied(metadata[0])) ++iter;

    return iter;
  }